

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createTexture_checker(SemanticParser *this,SP *in)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer *result;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  float fVar7;
  undefined1 auVar8 [16];
  SP SVar9;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  SemanticParser *local_c8;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_60;
  
  local_c8 = this;
  std::__shared_ptr<pbrt::CheckerTexture,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::CheckerTexture>>
            ((__shared_ptr<pbrt::CheckerTexture,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             (allocator<pbrt::CheckerTexture> *)&local_60);
  p_Var6 = *(_Rb_tree_node_base **)(*in_RDX + 0x20);
  p_Var5 = (_Rb_tree_node_base *)(*in_RDX + 0x10);
  _Var4._M_pi = extraout_RDX;
  if (p_Var6 != p_Var5) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_60,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var6 + 1));
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_60.first._M_dataplus._M_p,
                 local_60.first._M_dataplus._M_p + local_60.first._M_string_length);
      iVar1 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar1 == 0) {
        fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)(*in_RDX + 8),&local_c0,0.0);
        *(float *)&(local_d8->cameras).
                   super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                   ._M_impl.super__Vector_impl_data._M_start = fVar7;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar1 == 0) {
          fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)(*in_RDX + 8),&local_c0,0.0);
          *(float *)((long)&(local_d8->cameras).
                            super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                            ._M_impl.super__Vector_impl_data + 4) = fVar7;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar1 == 0) {
            result = (pointer *)
                     ((long)&(local_d8->cameras).
                             super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                             ._M_impl.super__Vector_impl_data + 8);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar1 != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_a0,"unknown checker texture param \'",&local_c0);
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
              local_80 = (long *)*plVar2;
              plVar3 = plVar2 + 2;
              if (local_80 == plVar3) {
                local_70 = *plVar3;
                lStack_68 = plVar2[3];
                local_80 = &local_70;
              }
              else {
                local_70 = *plVar3;
              }
              local_78 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              std::runtime_error::runtime_error(this_00,(string *)&local_80);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            result = (pointer *)
                     ((long)&(local_d8->cameras).
                             super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                             ._M_impl.super__Vector_impl_data + 0x14);
          }
          syntactic::ParamSet::getParam3f((ParamSet *)(*in_RDX + 8),(float *)result,&local_c0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_60.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p,
                        local_60.first.field_2._M_allocated_capacity + 1);
      }
      auVar8 = std::_Rb_tree_increment(p_Var6);
      _Var4._M_pi = auVar8._8_8_;
      p_Var6 = auVar8._0_8_;
    } while (p_Var6 != p_Var5);
  }
  (local_c8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  (local_c8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_d0;
  SVar9.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar9.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8;
  return (SP)SVar9.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_checker(pbrt::syntactic::Texture::SP in)
  {
    CheckerTexture::SP tex = std::make_shared<CheckerTexture>();
    for (auto it : in->param) {
      const std::string name = it.first;
      if (name == "uscale") {
        tex->uScale = in->getParam1f(name);
        continue;
      }
      if (name == "vscale") {
        tex->vScale = in->getParam1f(name);
        continue;
      }
      if (name == "tex1") {
        in->getParam3f(&tex->tex1.x,name);
        continue;
      }
      if (name == "tex2") {
        in->getParam3f(&tex->tex2.x,name);
        continue;
      }
      throw std::runtime_error("unknown checker texture param '"+name+"'");
    }
    return tex;
  }